

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_panel_begin(nk_context *ctx,char *title,nk_panel_type panel_type)

{
  nk_style_item_data *pnVar1;
  byte *pbVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  nk_panel *pnVar15;
  undefined1 auVar16 [16];
  undefined8 f;
  undefined8 string;
  uint uVar17;
  int iVar18;
  long lVar19;
  nk_style_window *pnVar20;
  nk_color c;
  ulong uVar21;
  nk_context *in;
  size_t __n;
  nk_command_buffer *b;
  nk_window *pnVar22;
  float fVar23;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar27 [12];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  nk_vec2 nVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  nk_rect r;
  nk_rect rect;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect b_00;
  nk_rect rect_00;
  nk_rect r_00;
  nk_flags ws;
  nk_flags local_bc;
  nk_vec2 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  nk_text local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  nk_command_buffer *local_38;
  
  local_88._8_8_ = local_88._0_8_;
  local_78._8_8_ = local_78._0_8_;
  local_78._0_8_ = title;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x3d03,
                  "int nk_panel_begin(struct nk_context *, const char *, enum nk_panel_type)");
  }
  pnVar22 = ctx->current;
  if (pnVar22 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x3d04,
                  "int nk_panel_begin(struct nk_context *, const char *, enum nk_panel_type)");
  }
  pnVar15 = pnVar22->layout;
  if (pnVar15 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x3d05,
                  "int nk_panel_begin(struct nk_context *, const char *, enum nk_panel_type)");
  }
  uVar21 = (ulong)pnVar15 & 3;
  if (uVar21 == 0) {
    memset(pnVar15,0,0x1c0);
  }
  else {
    __n = -uVar21 + 4;
    memset(pnVar15,0,__n);
    memset((void *)((long)pnVar15 + __n),0,0x1bc);
    memset((void *)((long)pnVar15 + -uVar21 + 0x1c0),0,uVar21);
    pnVar22 = ctx->current;
  }
  uVar17 = pnVar22->flags;
  if ((uVar17 & 0x6000) == 0) {
    local_88._0_8_ = (ctx->style).font;
    pnVar15 = pnVar22->layout;
    in = (nk_context *)0x0;
    if ((uVar17 >> 10 & 1) == 0) {
      in = ctx;
    }
    local_a8._0_4_ = (ctx->style).window.scrollbar_size.x;
    local_98 = (ctx->style).window.scrollbar_size.y;
    local_b8 = nk_panel_get_padding(&ctx->style,panel_type);
    fVar34 = local_b8.y;
    if ((uVar17 & 0x1002) == 2) {
      uVar3 = (pnVar22->bounds).x;
      uVar9 = (pnVar22->bounds).y;
      if ((local_78._0_8_ != 0) && ((uVar17 & 0x58) != 0)) {
        fVar34 = (ctx->style).window.header.padding.y;
        fVar35 = (ctx->style).window.header.label_padding.y;
        fVar34 = fVar35 + fVar35 + fVar34 + fVar34 + *(float *)(local_88._0_8_ + 8);
      }
      fVar35 = (in->input).mouse.buttons[0].clicked_pos.x;
      if (((((float)uVar3 <= fVar35) && (fVar35 < (float)uVar3 + (pnVar22->bounds).w)) &&
          (fVar23 = (in->input).mouse.buttons[0].clicked_pos.y, (float)uVar9 <= fVar23)) &&
         (((fVar23 < fVar34 + (float)uVar9 && ((in->input).mouse.buttons[0].down == 1)) &&
          ((in->input).mouse.buttons[0].clicked == 0)))) {
        nVar28 = (in->input).mouse.delta;
        fVar34 = nVar28.x;
        fVar36 = nVar28.y;
        (pnVar22->bounds).x = (float)uVar3 + fVar34;
        (pnVar22->bounds).y = (float)uVar9 + fVar36;
        nVar28.x = fVar35 + fVar34;
        nVar28.y = fVar23 + fVar36;
        (in->input).mouse.buttons[0].clicked_pos = nVar28;
        (ctx->style).cursor_active = (ctx->style).cursors[2];
      }
    }
    pnVar15->type = panel_type;
    pnVar15->flags = uVar17;
    fVar34 = (pnVar22->bounds).y;
    fVar35 = (pnVar22->bounds).w;
    fVar23 = (pnVar22->bounds).h;
    (pnVar15->bounds).x = (pnVar22->bounds).x;
    (pnVar15->bounds).y = fVar34;
    (pnVar15->bounds).w = fVar35;
    (pnVar15->bounds).h = fVar23;
    fVar34 = local_b8.x;
    fVar35 = (pnVar15->bounds).x + fVar34;
    (pnVar15->bounds).x = fVar35;
    (pnVar15->bounds).w = (pnVar15->bounds).w - (fVar34 + fVar34);
    if ((pnVar22->flags & 1) == 0) {
      pnVar15->border = 0.0;
      fVar34 = (pnVar15->bounds).y;
    }
    else {
      lVar19 = 0x1e68;
      if ((int)panel_type < 0x10) {
        if (panel_type == NK_PANEL_GROUP) {
          lVar19 = 0x1e78;
        }
        else if (panel_type == NK_PANEL_POPUP) {
          lVar19 = 0x1e80;
        }
      }
      else if (panel_type == NK_PANEL_CONTEXTUAL) {
        lVar19 = 0x1e70;
      }
      else if (panel_type == NK_PANEL_COMBO) {
        lVar19 = 0x1e6c;
      }
      else if (panel_type == NK_PANEL_MENU) {
        lVar19 = 0x1e74;
      }
      fVar23 = *(float *)((long)&(ctx->input).keyboard.keys[0].down + lVar19);
      pnVar15->border = fVar23;
      uVar4 = (pnVar15->bounds).x;
      uVar10 = (pnVar15->bounds).y;
      uVar5 = (pnVar15->bounds).w;
      uVar11 = (pnVar15->bounds).h;
      auVar30._4_4_ = uVar11;
      auVar30._0_4_ = uVar5;
      fVar35 = fVar23 + (float)uVar4;
      fVar34 = fVar23 + (float)uVar10;
      fVar23 = fVar23 + fVar23;
      auVar32._4_4_ = fVar23;
      auVar32._0_4_ = fVar23;
      auVar32._8_4_ = fVar23;
      auVar32._12_4_ = fVar23;
      auVar30._8_8_ = 0;
      auVar30 = maxps(auVar32,auVar30);
      (pnVar15->bounds).x = fVar35;
      (pnVar15->bounds).y = fVar34;
      (pnVar15->bounds).w = auVar30._0_4_ - fVar23;
      (pnVar15->bounds).h = auVar30._4_4_ - fVar23;
    }
    pnVar15->at_x = fVar35;
    pnVar15->at_y = fVar34;
    pnVar15->max_x = 0.0;
    pnVar15->footer_height = 0.0;
    pnVar15->header_height = 0.0;
    uStack_b0 = extraout_XMM0_Qb;
    nk_layout_reset_min_row_height(ctx);
    (pnVar15->row).index = 0;
    (pnVar15->row).columns = 0;
    (pnVar15->row).ratio = (float *)0x0;
    (pnVar15->row).item_width = 0.0;
    (pnVar15->row).tree_depth = 0;
    (pnVar15->row).height = local_b8.y;
    pnVar15->has_scrolling = 1;
    uVar17 = pnVar22->flags;
    if ((uVar17 & 0x20) == 0) {
      (pnVar15->bounds).w = (pnVar15->bounds).w - (float)local_a8._0_4_;
    }
    if ((panel_type & (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL)) ==
        NK_PANEL_NONE) {
      fVar34 = 0.0;
      if ((uVar17 & 0x24) != 0x20) {
        fVar34 = local_98;
      }
      pnVar15->footer_height = fVar34;
      (pnVar15->bounds).h = (pnVar15->bounds).h - fVar34;
      uVar17 = pnVar22->flags;
    }
    b = &pnVar22->buffer;
    if (((local_78._0_8_ != 0) && ((uVar17 & 0x58) != 0)) && ((uVar17 & 0x2000) == 0)) {
      local_b8.x = (pnVar22->bounds).x;
      local_b8.y = (pnVar22->bounds).y;
      fVar34 = (pnVar22->bounds).w;
      fVar35 = (ctx->style).window.header.padding.y;
      fVar23 = (ctx->style).window.header.label_padding.y;
      fVar35 = fVar23 + fVar23 + fVar35 + fVar35 + *(float *)(local_88._0_8_ + 8);
      pnVar15->header_height = fVar35;
      (pnVar15->bounds).y = (pnVar15->bounds).y + fVar35;
      (pnVar15->bounds).h = (pnVar15->bounds).h - fVar35;
      pnVar15->at_y = pnVar15->at_y + fVar35;
      if (ctx->active == pnVar22) {
        pnVar20 = (nk_style_window *)&(ctx->style).window.header.active;
        local_68.text = (ctx->style).window.header.label_active;
      }
      else {
        fVar23 = (ctx->input).mouse.pos.x;
        if ((((fVar23 < local_b8.x) || (local_b8.x + fVar34 <= fVar23)) ||
            (fVar23 = (ctx->input).mouse.pos.y, fVar23 < local_b8.y)) ||
           (local_b8.y + fVar35 <= fVar23)) {
          pnVar20 = &(ctx->style).window;
          local_68.text = (ctx->style).window.header.label_normal;
        }
        else {
          pnVar20 = (nk_style_window *)&(ctx->style).window.header.hover;
          local_68.text = (ctx->style).window.header.label_hover;
        }
      }
      fVar35 = fVar35 + 1.0;
      local_48 = ZEXT416((uint)fVar35);
      local_58 = ZEXT416((uint)fVar34);
      r._8_8_ = CONCAT44(fVar35,fVar34);
      pnVar1 = &(pnVar20->header).normal.data;
      uStack_b0 = 0;
      local_a8._8_8_ = 0;
      local_a8._0_8_ = r._8_8_;
      local_98 = local_b8.y;
      fStack_94 = local_b8.y;
      fStack_90 = local_b8.y;
      fStack_8c = local_b8.y;
      if ((pnVar20->header).normal.type == NK_STYLE_ITEM_IMAGE) {
        r.x = local_b8.x;
        r.y = local_b8.y;
        nk_draw_image(b,r,&pnVar1->image,(nk_color)0xffffffff);
        c.r = '\0';
        c.g = '\0';
        c.b = '\0';
        c.a = '\0';
      }
      else {
        c = pnVar1->color;
        rect.w = fVar34;
        rect.h = fVar35;
        rect.x = local_b8.x;
        rect.y = local_b8.y;
        nk_fill_rect(b,rect,0.0,c);
      }
      fVar34 = (ctx->style).window.header.padding.y;
      fVar35 = local_98 + fVar34;
      fVar34 = (float)local_48._0_4_ - (fVar34 + fVar34);
      auVar30 = CONCAT412(fVar34,CONCAT48(fVar34,CONCAT44(fVar34,fVar34)));
      uVar17 = pnVar22->flags;
      local_68.background = c;
      if ((uVar17 & 8) != 0) {
        local_bc = 0;
        local_48._0_4_ = fVar34;
        if ((ctx->style).window.header.align == NK_HEADER_RIGHT) {
          fVar23 = (ctx->style).window.header.padding.x;
          local_98 = (local_b8.x + (float)local_58._0_4_) - (fVar34 + fVar23);
          local_a8._0_4_ =
               (float)local_58._0_4_ - ((ctx->style).window.header.spacing.x + fVar34 + fVar23);
        }
        else {
          fVar23 = (ctx->style).window.header.padding.x;
          local_98 = local_b8.x + fVar23;
          local_b8.x = local_b8.x + (ctx->style).window.header.spacing.x + fVar34 + fVar23;
        }
        bounds.y = fVar35;
        bounds.x = local_98;
        bounds.w = fVar34;
        bounds.h = fVar34;
        fStack_94 = fVar35;
        fStack_90 = fVar35;
        fStack_8c = fVar35;
        local_58 = auVar30;
        iVar18 = nk_do_button_symbol(&local_bc,b,bounds,(ctx->style).window.header.close_symbol,
                                     NK_BUTTON_DEFAULT,&(ctx->style).window.header.close_button,
                                     &in->input,(ctx->style).font);
        uVar17 = pnVar22->flags;
        if ((uVar17 >> 0xc & 1) == 0 && iVar18 != 0) {
          pnVar15->flags = pnVar15->flags & 0xffff5fff | 0x2000;
        }
        auVar30 = local_58;
        fVar35 = fStack_94;
        fVar34 = (float)local_48._0_4_;
      }
      local_38 = b;
      if ((uVar17 & 0x10) != 0) {
        local_bc = 0;
        fVar23 = local_b8.x;
        if ((ctx->style).window.header.align == NK_HEADER_RIGHT) {
          auVar27 = local_a8._4_12_;
          fVar23 = (local_a8._0_4_ + local_b8.x) - fVar34;
          if ((uVar17 & 8) == 0) {
            fVar36 = (ctx->style).window.header.padding.x;
            fVar23 = fVar23 - fVar36;
            auVar24._0_8_ = local_a8._4_8_ << 0x20;
            auVar24._8_4_ = local_a8._8_4_;
            auVar24._12_4_ = local_a8._12_4_;
            local_a8._0_4_ = local_a8._0_4_ - fVar36;
            local_a8._4_12_ = auVar27;
            auVar27 = auVar24._4_12_;
          }
          else {
            auVar25._0_8_ = local_a8._4_8_ << 0x20;
            auVar25._8_4_ = local_a8._8_4_;
            auVar25._12_4_ = local_a8._12_4_;
            auVar27 = auVar25._4_12_;
          }
          fVar36 = local_a8._0_4_;
          local_a8._4_12_ = auVar27;
          local_a8._0_4_ = fVar36 - (fVar34 + (ctx->style).window.header.spacing.x);
        }
        else {
          local_b8.x = local_b8.x +
                       fVar34 + (ctx->style).window.header.spacing.x +
                       (ctx->style).window.header.padding.x;
        }
        bounds_00.y = fVar35;
        bounds_00.x = fVar23;
        bounds_00._8_8_ = auVar30._0_8_;
        iVar18 = nk_do_button_symbol(&local_bc,b,bounds_00,
                                     (&(ctx->style).window.header.minimize_symbol)
                                     [(ushort)((ushort)pnVar15->flags >> 0xf)],NK_BUTTON_DEFAULT,
                                     &(ctx->style).window.header.minimize_button,&in->input,
                                     (ctx->style).font);
        if ((iVar18 != 0) && ((pnVar22->flags & 0x1000) == 0)) {
          pbVar2 = (byte *)((long)&pnVar15->flags + 1);
          *pbVar2 = *pbVar2 ^ 0x80;
        }
      }
      string = local_78._0_8_;
      iVar18 = nk_strlen((char *)local_78._0_8_);
      f = local_88._0_8_;
      fVar35 = (*(code *)*(nk_handle *)(local_88._0_8_ + 0x10))
                         (*(nk_handle *)local_88._0_8_,
                          (float)((nk_handle *)(local_88._0_8_ + 8))->id,(char *)string,iVar18);
      b = local_38;
      local_68.padding.x = 0.0;
      local_68.padding.y = 0.0;
      nVar28 = (ctx->style).window.header.label_padding;
      fVar36 = local_b8.x + (ctx->style).window.header.padding.x + nVar28.x;
      fVar23 = nVar28.y;
      fVar34 = (ctx->style).window.header.spacing.x;
      fVar35 = fVar34 + fVar34 + fVar35;
      fVar34 = ((float)local_a8._0_4_ + local_b8.x) - fVar36;
      if (fVar34 <= fVar35) {
        fVar35 = fVar34;
      }
      fVar34 = 0.0;
      if (0.0 <= fVar35) {
        fVar34 = fVar35;
      }
      b_00.h = fVar23 + fVar23 + *(float *)(f + 8);
      b_00.w = fVar34;
      b_00.y = local_b8.y + fVar23;
      b_00.x = fVar36;
      nk_widget_text(local_38,b_00,(char *)string,iVar18,&local_68,0x11,(nk_user_font *)f);
    }
    if ((pnVar15->flags & 0x8800) == 0) {
      fVar23 = (pnVar22->bounds).y + pnVar15->header_height;
      fVar34 = (pnVar22->bounds).x;
      fVar35 = (pnVar22->bounds).w;
      fVar36 = (pnVar22->bounds).h - pnVar15->header_height;
      pnVar1 = &(ctx->style).window.fixed_background.data;
      if ((ctx->style).window.fixed_background.type == NK_STYLE_ITEM_IMAGE) {
        nk_draw_image(b,(nk_rect)CONCAT88(CONCAT44(fVar36,fVar35),CONCAT44(fVar23,fVar34)),
                      &pnVar1->image,(nk_color)0xffffffff);
      }
      else {
        rect_00.w = fVar35;
        rect_00.h = fVar36;
        rect_00.x = fVar34;
        rect_00.y = fVar23;
        nk_fill_rect(b,rect_00,0.0,pnVar1->color);
      }
    }
    fVar34 = (pnVar15->bounds).y;
    fVar35 = (pnVar15->bounds).w;
    fVar23 = (pnVar15->bounds).h;
    (pnVar15->clip).x = (pnVar15->bounds).x;
    (pnVar15->clip).y = fVar34;
    (pnVar15->clip).w = fVar35;
    (pnVar15->clip).h = fVar23;
    uVar21._0_4_ = (pnVar15->clip).x;
    uVar21._4_4_ = (pnVar15->clip).y;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar21;
    uVar6 = (pnVar15->clip).w;
    uVar12 = (pnVar15->clip).h;
    auVar33._0_4_ = (float)uVar6 + (float)(undefined4)uVar21;
    auVar33._4_4_ = (float)uVar12 + (float)uVar21._4_4_;
    auVar33._8_8_ = 0;
    uVar7 = (pnVar22->buffer).clip.x;
    uVar13 = (pnVar22->buffer).clip.y;
    auVar16._4_4_ = uVar13;
    auVar16._0_4_ = uVar7;
    uVar8 = (pnVar22->buffer).clip.w;
    uVar14 = (pnVar22->buffer).clip.h;
    auVar16._8_8_ = 0;
    local_78 = maxps(auVar26,auVar16);
    auVar29._0_4_ = (float)uVar8 + (float)uVar7;
    auVar29._4_4_ = (float)uVar14 + (float)uVar13;
    auVar29._8_8_ = 0;
    auVar30 = minps(auVar29,auVar33);
    auVar31._0_4_ = auVar30._0_4_ - local_78._0_4_;
    auVar31._4_4_ = auVar30._4_4_ - local_78._4_4_;
    auVar31._8_4_ = auVar30._8_4_ - local_78._8_4_;
    auVar31._12_4_ = auVar30._12_4_ - local_78._12_4_;
    local_88 = maxps(auVar31,ZEXT816(0));
    r_00._0_8_ = local_78._0_8_;
    r_00._8_8_ = local_88._0_8_;
    nk_push_scissor(b,r_00);
    (pnVar15->clip).x = (float)local_78._0_4_;
    (pnVar15->clip).y = (float)local_78._4_4_;
    (pnVar15->clip).w = (float)local_88._0_4_;
    (pnVar15->clip).h = (float)local_88._4_4_;
    uVar17 = (uint)(-1 < (short)pnVar15->flags);
    if ((pnVar15->flags >> 0xd & 1) != 0) {
      uVar17 = 0;
    }
  }
  else {
    nk_zero(pnVar22->layout,0x1c0);
    ctx->current->layout->type = panel_type;
    uVar17 = 0;
  }
  return uVar17;
}

Assistant:

NK_LIB int
nk_panel_begin(struct nk_context *ctx, const char *title, enum nk_panel_type panel_type)
{
    struct nk_input *in;
    struct nk_window *win;
    struct nk_panel *layout;
    struct nk_command_buffer *out;
    const struct nk_style *style;
    const struct nk_user_font *font;

    struct nk_vec2 scrollbar_size;
    struct nk_vec2 panel_padding;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout) return 0;
    nk_zero(ctx->current->layout, sizeof(*ctx->current->layout));
    if ((ctx->current->flags & NK_WINDOW_HIDDEN) || (ctx->current->flags & NK_WINDOW_CLOSED)) {
        nk_zero(ctx->current->layout, sizeof(struct nk_panel));
        ctx->current->layout->type = panel_type;
        return 0;
    }
    /* pull state into local stack */
    style = &ctx->style;
    font = style->font;
    win = ctx->current;
    layout = win->layout;
    out = &win->buffer;
    in = (win->flags & NK_WINDOW_NO_INPUT) ? 0: &ctx->input;
#ifdef NK_INCLUDE_COMMAND_USERDATA
    win->buffer.userdata = ctx->userdata;
#endif
    /* pull style configuration into local stack */
    scrollbar_size = style->window.scrollbar_size;
    panel_padding = nk_panel_get_padding(style, panel_type);

    /* window movement */
    if ((win->flags & NK_WINDOW_MOVABLE) && !(win->flags & NK_WINDOW_ROM)) {
        int left_mouse_down;
        int left_mouse_clicked;
        int left_mouse_click_in_cursor;

        /* calculate draggable window space */
        struct nk_rect header;
        header.x = win->bounds.x;
        header.y = win->bounds.y;
        header.w = win->bounds.w;
        if (nk_panel_has_header(win->flags, title)) {
            header.h = font->height + 2.0f * style->window.header.padding.y;
            header.h += 2.0f * style->window.header.label_padding.y;
        } else header.h = panel_padding.y;

        /* window movement by dragging */
        left_mouse_down = in->mouse.buttons[NK_BUTTON_LEFT].down;
        left_mouse_clicked = (int)in->mouse.buttons[NK_BUTTON_LEFT].clicked;
        left_mouse_click_in_cursor = nk_input_has_mouse_click_down_in_rect(in,
            NK_BUTTON_LEFT, header, nk_true);
        if (left_mouse_down && left_mouse_click_in_cursor && !left_mouse_clicked) {
            win->bounds.x = win->bounds.x + in->mouse.delta.x;
            win->bounds.y = win->bounds.y + in->mouse.delta.y;
            in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.x += in->mouse.delta.x;
            in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.y += in->mouse.delta.y;
            ctx->style.cursor_active = ctx->style.cursors[NK_CURSOR_MOVE];
        }
    }

    /* setup panel */
    layout->type = panel_type;
    layout->flags = win->flags;
    layout->bounds = win->bounds;
    layout->bounds.x += panel_padding.x;
    layout->bounds.w -= 2*panel_padding.x;
    if (win->flags & NK_WINDOW_BORDER) {
        layout->border = nk_panel_get_border(style, win->flags, panel_type);
        layout->bounds = nk_shrink_rect(layout->bounds, layout->border);
    } else layout->border = 0;
    layout->at_y = layout->bounds.y;
    layout->at_x = layout->bounds.x;
    layout->max_x = 0;
    layout->header_height = 0;
    layout->footer_height = 0;
    nk_layout_reset_min_row_height(ctx);
    layout->row.index = 0;
    layout->row.columns = 0;
    layout->row.ratio = 0;
    layout->row.item_width = 0;
    layout->row.tree_depth = 0;
    layout->row.height = panel_padding.y;
    layout->has_scrolling = nk_true;
    if (!(win->flags & NK_WINDOW_NO_SCROLLBAR))
        layout->bounds.w -= scrollbar_size.x;
    if (!nk_panel_is_nonblock(panel_type)) {
        layout->footer_height = 0;
        if (!(win->flags & NK_WINDOW_NO_SCROLLBAR) || win->flags & NK_WINDOW_SCALABLE)
            layout->footer_height = scrollbar_size.y;
        layout->bounds.h -= layout->footer_height;
    }

    /* panel header */
    if (nk_panel_has_header(win->flags, title))
    {
        struct nk_text text;
        struct nk_rect header;
        const struct nk_style_item *background = 0;

        /* calculate header bounds */
        header.x = win->bounds.x;
        header.y = win->bounds.y;
        header.w = win->bounds.w;
        header.h = font->height + 2.0f * style->window.header.padding.y;
        header.h += (2.0f * style->window.header.label_padding.y);

        /* shrink panel by header */
        layout->header_height = header.h;
        layout->bounds.y += header.h;
        layout->bounds.h -= header.h;
        layout->at_y += header.h;

        /* select correct header background and text color */
        if (ctx->active == win) {
            background = &style->window.header.active;
            text.text = style->window.header.label_active;
        } else if (nk_input_is_mouse_hovering_rect(&ctx->input, header)) {
            background = &style->window.header.hover;
            text.text = style->window.header.label_hover;
        } else {
            background = &style->window.header.normal;
            text.text = style->window.header.label_normal;
        }

        /* draw header background */
        header.h += 1.0f;
        if (background->type == NK_STYLE_ITEM_IMAGE) {
            text.background = nk_rgba(0,0,0,0);
            nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
        } else {
            text.background = background->data.color;
            nk_fill_rect(out, header, 0, background->data.color);
        }

        /* window close button */
        {struct nk_rect button;
        button.y = header.y + style->window.header.padding.y;
        button.h = header.h - 2 * style->window.header.padding.y;
        button.w = button.h;
        if (win->flags & NK_WINDOW_CLOSABLE) {
            nk_flags ws = 0;
            if (style->window.header.align == NK_HEADER_RIGHT) {
                button.x = (header.w + header.x) - (button.w + style->window.header.padding.x);
                header.w -= button.w + style->window.header.spacing.x + style->window.header.padding.x;
            } else {
                button.x = header.x + style->window.header.padding.x;
                header.x += button.w + style->window.header.spacing.x + style->window.header.padding.x;
            }

            if (nk_do_button_symbol(&ws, &win->buffer, button,
                style->window.header.close_symbol, NK_BUTTON_DEFAULT,
                &style->window.header.close_button, in, style->font) && !(win->flags & NK_WINDOW_ROM))
            {
                layout->flags |= NK_WINDOW_HIDDEN;
                layout->flags &= (nk_flags)~NK_WINDOW_MINIMIZED;
            }
        }

        /* window minimize button */
        if (win->flags & NK_WINDOW_MINIMIZABLE) {
            nk_flags ws = 0;
            if (style->window.header.align == NK_HEADER_RIGHT) {
                button.x = (header.w + header.x) - button.w;
                if (!(win->flags & NK_WINDOW_CLOSABLE)) {
                    button.x -= style->window.header.padding.x;
                    header.w -= style->window.header.padding.x;
                }
                header.w -= button.w + style->window.header.spacing.x;
            } else {
                button.x = header.x;
                header.x += button.w + style->window.header.spacing.x + style->window.header.padding.x;
            }
            if (nk_do_button_symbol(&ws, &win->buffer, button, (layout->flags & NK_WINDOW_MINIMIZED)?
                style->window.header.maximize_symbol: style->window.header.minimize_symbol,
                NK_BUTTON_DEFAULT, &style->window.header.minimize_button, in, style->font) && !(win->flags & NK_WINDOW_ROM))
                layout->flags = (layout->flags & NK_WINDOW_MINIMIZED) ?
                    layout->flags & (nk_flags)~NK_WINDOW_MINIMIZED:
                    layout->flags | NK_WINDOW_MINIMIZED;
        }}

        {/* window header title */
        int text_len = nk_strlen(title);
        struct nk_rect label = {0,0,0,0};
        float t = font->width(font->userdata, font->height, title, text_len);
        text.padding = nk_vec2(0,0);

        label.x = header.x + style->window.header.padding.x;
        label.x += style->window.header.label_padding.x;
        label.y = header.y + style->window.header.label_padding.y;
        label.h = font->height + 2 * style->window.header.label_padding.y;
        label.w = t + 2 * style->window.header.spacing.x;
        label.w = NK_CLAMP(0, label.w, header.x + header.w - label.x);
        nk_widget_text(out, label,(const char*)title, text_len, &text, NK_TEXT_LEFT, font);}
    }

    /* draw window background */
    if (!(layout->flags & NK_WINDOW_MINIMIZED) && !(layout->flags & NK_WINDOW_DYNAMIC)) {
        struct nk_rect body;
        body.x = win->bounds.x;
        body.w = win->bounds.w;
        body.y = (win->bounds.y + layout->header_height);
        body.h = (win->bounds.h - layout->header_height);
        if (style->window.fixed_background.type == NK_STYLE_ITEM_IMAGE)
            nk_draw_image(out, body, &style->window.fixed_background.data.image, nk_white);
        else nk_fill_rect(out, body, 0, style->window.fixed_background.data.color);
    }

    /* set clipping rectangle */
    {struct nk_rect clip;
    layout->clip = layout->bounds;
    nk_unify(&clip, &win->buffer.clip, layout->clip.x, layout->clip.y,
        layout->clip.x + layout->clip.w, layout->clip.y + layout->clip.h);
    nk_push_scissor(out, clip);
    layout->clip = clip;}
    return !(layout->flags & NK_WINDOW_HIDDEN) && !(layout->flags & NK_WINDOW_MINIMIZED);
}